

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

int sha256_update(sha256_context *ctx,uchar *input,size_t ilen)

{
  uint uVar1;
  uint uVar2;
  ulong __n;
  
  if (ilen != 0) {
    uVar2 = ctx->total[0];
    uVar1 = uVar2 & 0x3f;
    ctx->total[0] = (uint)ilen + uVar2;
    if (CARRY4((uint)ilen,uVar2)) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    uVar2 = 0;
    if (uVar1 != 0) {
      __n = 0x40 - (ulong)uVar1;
      uVar2 = uVar1;
      if (__n <= ilen) {
        memcpy(ctx->buffer + uVar1,input,__n);
        internal_sha256_process(ctx,ctx->buffer);
        input = input + __n;
        ilen = ilen - __n;
        uVar2 = 0;
      }
    }
    for (; 0x3f < ilen; ilen = ilen - 0x40) {
      internal_sha256_process(ctx,input);
      input = input + 0x40;
    }
    if (ilen != 0) {
      memcpy(ctx->buffer + uVar2,input,ilen);
    }
  }
  return 0;
}

Assistant:

int sha256_update(sha256_context *ctx,
  const unsigned char *input,
  size_t ilen) {
  int ret;
  size_t fill;
  uint32_t left;

  if (ilen == 0)
    return(0);

  left = ctx->total[0] & 0x3F;
  fill = 64 - left;

  ctx->total[0] += (uint32_t)ilen;
  ctx->total[0] &= 0xFFFFFFFF;

  if (ctx->total[0] < (uint32_t)ilen)
    ctx->total[1]++;

  if (left && ilen >= fill) {
    memcpy((void *)(ctx->buffer + left), input, fill);

    if ((ret = internal_sha256_process(ctx, ctx->buffer)) != 0)
      return(ret);

    input += fill;
    ilen -= fill;
    left = 0;
  }

  while (ilen >= 64) {
    if ((ret = internal_sha256_process(ctx, input)) != 0)
      return(ret);

    input += 64;
    ilen -= 64;
  }

  if (ilen > 0)
    memcpy((void *)(ctx->buffer + left), input, ilen);

  return(0);
}